

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlist.cpp
# Opt level: O0

qsizetype accumulatedSize(QStringList *list,qsizetype seplen)

{
  bool bVar1;
  const_iterator o;
  QString *this;
  qsizetype qVar2;
  long in_RSI;
  long in_FS_OFFSET;
  QString *e;
  QStringList *__range2;
  qsizetype result;
  const_iterator __end2;
  const_iterator __begin2;
  QList<QString> *in_stack_ffffffffffffffb0;
  long local_38;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = 0;
  bVar1 = QList<QString>::isEmpty((QList<QString> *)0x1691ff);
  if (!bVar1) {
    local_10.i = (QString *)0xaaaaaaaaaaaaaaaa;
    local_10 = QList<QString>::begin(in_stack_ffffffffffffffb0);
    o = QList<QString>::end(in_stack_ffffffffffffffb0);
    while( true ) {
      bVar1 = QList<QString>::const_iterator::operator!=(&local_10,o);
      if (!bVar1) break;
      this = QList<QString>::const_iterator::operator*(&local_10);
      qVar2 = QString::size(this);
      local_38 = qVar2 + in_RSI + local_38;
      QList<QString>::const_iterator::operator++(&local_10);
    }
    local_38 = local_38 - in_RSI;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_38;
  }
  __stack_chk_fail();
}

Assistant:

static qsizetype accumulatedSize(const QStringList &list, qsizetype seplen)
{
    qsizetype result = 0;
    if (!list.isEmpty()) {
        for (const auto &e : list)
            result += e.size() + seplen;
        result -= seplen;
    }
    return result;
}